

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O1

pic_buf_t * ihevc_dpb_mgr_get_ref_by_poc(dpb_mgr_t *ps_dpb_mgr,WORD32 abs_poc)

{
  uint uVar1;
  pic_buf_t *ppVar2;
  uint uVar3;
  uint uVar4;
  pic_buf_t *ppVar5;
  
  uVar4 = 0;
  uVar3 = (uint)ps_dpb_mgr->u1_num_ref_bufs;
  uVar1 = uVar4;
  if (ps_dpb_mgr->u1_num_ref_bufs != 0) {
    do {
      ppVar5 = ps_dpb_mgr->ps_dpb_head->ps_pic_buf;
      if (ppVar5->i4_abs_poc == abs_poc) goto LAB_0016ba1b;
      ps_dpb_mgr = (dpb_mgr_t *)&ps_dpb_mgr->ps_dpb_head->ps_prev_dpb;
      uVar4 = uVar4 + 1;
      uVar1 = uVar3;
    } while (uVar3 != uVar4);
  }
  uVar4 = uVar1;
  ppVar5 = (pic_buf_t *)0x0;
LAB_0016ba1b:
  ppVar2 = (pic_buf_t *)0x0;
  if (uVar4 != uVar3) {
    ppVar2 = ppVar5;
  }
  return ppVar2;
}

Assistant:

pic_buf_t* ihevc_dpb_mgr_get_ref_by_poc(dpb_mgr_t *ps_dpb_mgr, WORD32 abs_poc)
{
    UWORD32 i;
    dpb_info_t *ps_next_ref;
    pic_buf_t *ps_pic_buf = NULL;


    ps_next_ref = ps_dpb_mgr->ps_dpb_head;
    for(i = 0; i < ps_dpb_mgr->u1_num_ref_bufs; i++)
    {
        if(ps_next_ref->ps_pic_buf->i4_abs_poc == abs_poc)
        {
            ps_pic_buf = ps_next_ref->ps_pic_buf;
            break;
        }

        ps_next_ref = ps_next_ref->ps_prev_dpb;
    }

    if(i == ps_dpb_mgr->u1_num_ref_bufs)
    {
        ps_pic_buf = NULL;
    }

    return ps_pic_buf;
}